

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::ThreadPool::setNumThreads(ThreadPool *this,int count)

{
  bool bVar1;
  uint uVar2;
  ArgExc *this_00;
  ThreadPoolProvider *pTVar3;
  uint in_ESI;
  DefaultThreadPoolProvider *dpp;
  NullThreadPoolProvider *npp;
  int curT;
  SafeProvider sp;
  bool doReset;
  SafeProvider *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  int count_00;
  DefaultThreadPoolProvider *in_stack_ffffffffffffff70;
  Data *in_stack_ffffffffffffff78;
  long local_80;
  SafeProvider local_20;
  byte local_d;
  uint local_c;
  
  count_00 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (-1 < (int)in_ESI) {
    local_d = 0;
    local_c = in_ESI;
    Data::getProvider((Data *)in_stack_ffffffffffffff70);
    pTVar3 = Data::SafeProvider::operator->((SafeProvider *)0x109ef0);
    uVar2 = (*pTVar3->_vptr_ThreadPoolProvider[2])();
    if (uVar2 == local_c) {
      bVar1 = true;
    }
    else {
      if (uVar2 == 0) {
        pTVar3 = Data::SafeProvider::get(&local_20);
        if (pTVar3 == (ThreadPoolProvider *)0x0) {
          local_80 = 0;
        }
        else {
          local_80 = __dynamic_cast(pTVar3,&ThreadPoolProvider::typeinfo,
                                    &(anonymous_namespace)::NullThreadPoolProvider::typeinfo,0);
        }
        if (local_80 != 0) {
          local_d = 1;
        }
      }
      else if (local_c == 0) {
        in_stack_ffffffffffffff78 = (Data *)Data::SafeProvider::get(&local_20);
        if (in_stack_ffffffffffffff78 == (Data *)0x0) {
          in_stack_ffffffffffffff70 = (DefaultThreadPoolProvider *)0x0;
        }
        else {
          in_stack_ffffffffffffff70 =
               (DefaultThreadPoolProvider *)
               __dynamic_cast(in_stack_ffffffffffffff78,&ThreadPoolProvider::typeinfo,
                              &(anonymous_namespace)::DefaultThreadPoolProvider::typeinfo,0);
        }
        if (in_stack_ffffffffffffff70 != (DefaultThreadPoolProvider *)0x0) {
          local_d = 1;
        }
      }
      if ((local_d & 1) == 0) {
        pTVar3 = Data::SafeProvider::operator->((SafeProvider *)0x10a057);
        (*pTVar3->_vptr_ThreadPoolProvider[3])(pTVar3,(ulong)local_c);
        count_00 = (int)((ulong)pTVar3 >> 0x20);
      }
      bVar1 = false;
    }
    Data::SafeProvider::~SafeProvider(in_stack_ffffffffffffff50);
    if ((!bVar1) && ((local_d & 1) != 0)) {
      if (local_c == 0) {
        operator_new(8);
        anon_unknown_5::NullThreadPoolProvider::NullThreadPoolProvider
                  ((NullThreadPoolProvider *)in_stack_ffffffffffffff50);
        Data::setProvider(in_stack_ffffffffffffff78,
                          &in_stack_ffffffffffffff70->super_ThreadPoolProvider);
      }
      else {
        operator_new(0xe0);
        anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider
                  (in_stack_ffffffffffffff70,count_00);
        Data::setProvider(in_stack_ffffffffffffff78,
                          &in_stack_ffffffffffffff70->super_ThreadPoolProvider);
      }
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (this_00,"Attempt to set the number of threads in a thread pool to a negative value.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
ThreadPool::setNumThreads (int count)
{
    if (count < 0)
        throw IEX_INTERNAL_NAMESPACE::ArgExc ("Attempt to set the number of threads "
               "in a thread pool to a negative value.");

    bool doReset = false;
    {
        Data::SafeProvider sp = _data->getProvider ();
        int curT = sp->numThreads ();
        if ( curT == count )
            return;

        if ( curT == 0 )
        {
            NullThreadPoolProvider *npp = dynamic_cast<NullThreadPoolProvider *>( sp.get() );
            if ( npp )
                doReset = true;
        }
        else if ( count == 0 )
        {
            DefaultThreadPoolProvider *dpp = dynamic_cast<DefaultThreadPoolProvider *>( sp.get() );
            if ( dpp )
                doReset = true;
        }
        if ( ! doReset )
            sp->setNumThreads( count );
    }

    if ( doReset )
    {
        if ( count == 0 )
            _data->setProvider( new NullThreadPoolProvider );
        else
            _data->setProvider( new DefaultThreadPoolProvider( count ) );
    }
}